

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffers_iterator.hpp
# Opt level: O1

void __thiscall
asio::buffers_iterator<asio::const_buffers_1,_char>::advance
          (buffers_iterator<asio::const_buffers_1,_char> *this,ptrdiff_t n)

{
  buffer_sequence_iterator_type pcVar1;
  ulong uVar2;
  void *pvVar3;
  buffer_sequence_iterator_type pcVar4;
  buffer_sequence_iterator_type pcVar5;
  ulong uVar6;
  size_t sVar7;
  ulong uVar8;
  size_t sVar9;
  long lVar10;
  long lVar11;
  bool bVar12;
  
  if (n < 1) {
    if (n < 0) {
      uVar8 = -n;
      uVar6 = this->current_buffer_position_;
      if (uVar6 < uVar8) {
        pcVar1 = this->begin_;
        pcVar4 = this->current_;
        sVar9 = this->position_;
        do {
          sVar9 = sVar9 - uVar6;
          this->position_ = sVar9;
          if (pcVar4 == pcVar1) {
            sVar9 = 0;
            goto LAB_001c832d;
          }
          uVar8 = uVar8 - uVar6;
          pcVar5 = pcVar4;
          do {
            if (pcVar5 == pcVar1) goto LAB_001c8317;
            uVar2 = pcVar5[-1].size_;
            pcVar5 = pcVar5 + -1;
          } while (uVar2 == 0);
          pvVar3 = pcVar5->data_;
          this->current_ = pcVar5;
          (this->current_buffer_).data_ = pvVar3;
          (this->current_buffer_).size_ = uVar2;
          this->current_buffer_position_ = uVar2;
          uVar6 = uVar2;
          pcVar4 = pcVar5;
LAB_001c8317:
        } while (uVar6 < uVar8);
      }
      this->position_ = this->position_ - uVar8;
      sVar9 = uVar6 - uVar8;
LAB_001c832d:
      this->current_buffer_position_ = sVar9;
      return;
    }
  }
  else {
    sVar9 = this->current_buffer_position_;
    pcVar1 = this->end_;
    sVar7 = this->position_;
    pcVar4 = this->current_;
    do {
      lVar11 = (this->current_buffer_).size_ - sVar9;
      lVar10 = n - lVar11;
      if (n < lVar11) {
        sVar7 = sVar7 + n;
        this->position_ = sVar7;
        sVar9 = sVar9 + n;
        bVar12 = false;
        pcVar5 = pcVar4;
        lVar10 = n;
      }
      else {
        sVar7 = sVar7 + lVar11;
        this->position_ = sVar7;
        pcVar5 = pcVar4 + 1;
        this->current_ = pcVar5;
        bVar12 = pcVar5 == pcVar1;
        if (bVar12) {
          (this->current_buffer_).data_ = (void *)0x0;
          (this->current_buffer_).size_ = 0;
        }
        else {
          sVar9 = pcVar4[1].size_;
          (this->current_buffer_).data_ = pcVar5->data_;
          (this->current_buffer_).size_ = sVar9;
        }
        sVar9 = 0;
        bVar12 = !bVar12;
      }
      this->current_buffer_position_ = sVar9;
      pcVar4 = pcVar5;
      n = lVar10;
    } while (bVar12);
  }
  return;
}

Assistant:

void advance(std::ptrdiff_t n)
  {
    if (n > 0)
    {
      ASIO_ASSERT(current_ != end_ && "iterator out of bounds");
      for (;;)
      {
        std::ptrdiff_t current_buffer_balance
          = current_buffer_.size() - current_buffer_position_;

        // Check if the advance can be satisfied by the current buffer.
        if (current_buffer_balance > n)
        {
          position_ += n;
          current_buffer_position_ += n;
          return;
        }

        // Update position.
        n -= current_buffer_balance;
        position_ += current_buffer_balance;

        // Move to next buffer. If it is empty then it will be skipped on the
        // next iteration of this loop.
        if (++current_ == end_)
        {
          ASIO_ASSERT(n == 0 && "iterator out of bounds");
          current_buffer_ = buffer_type();
          current_buffer_position_ = 0;
          return;
        }
        current_buffer_ = *current_;
        current_buffer_position_ = 0;
      }
    }
    else if (n < 0)
    {
      std::size_t abs_n = -n;
      ASIO_ASSERT(position_ >= abs_n && "iterator out of bounds");
      for (;;)
      {
        // Check if the advance can be satisfied by the current buffer.
        if (current_buffer_position_ >= abs_n)
        {
          position_ -= abs_n;
          current_buffer_position_ -= abs_n;
          return;
        }

        // Update position.
        abs_n -= current_buffer_position_;
        position_ -= current_buffer_position_;

        // Check if we've reached the beginning of the buffers.
        if (current_ == begin_)
        {
          ASIO_ASSERT(abs_n == 0 && "iterator out of bounds");
          current_buffer_position_ = 0;
          return;
        }

        // Find the previous non-empty buffer.
        buffer_sequence_iterator_type iter = current_;
        while (iter != begin_)
        {
          --iter;
          buffer_type buffer = *iter;
          std::size_t buffer_size = buffer.size();
          if (buffer_size > 0)
          {
            current_ = iter;
            current_buffer_ = buffer;
            current_buffer_position_ = buffer_size;
            break;
          }
        }
      }
    }
  }